

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

void __thiscall ezc3d::DataNS::Points3dNS::Point::print(Point *this)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  ulong __n;
  size_t i;
  ulong __n_00;
  double extraout_XMM0_Qa;
  
  Vector3d::print(&this->super_Vector3d);
  std::operator<<((ostream *)&std::cout,"Residual = ");
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x28])(this);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::operator<<(poVar1,"; Masks = [");
  __n_00 = 0;
  while( true ) {
    uVar3 = (ulong)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    lVar2 = (long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __n = (uVar3 + lVar2 * 8) - 1;
    if (__n <= __n_00) break;
    std::vector<bool,_std::allocator<bool>_>::operator[](&this->_cameraMasks,__n_00);
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::operator<<(poVar1,", ");
    __n_00 = __n_00 + 1;
  }
  if (uVar3 + lVar2 * 8 != 0) {
    std::vector<bool,_std::allocator<bool>_>::operator[](&this->_cameraMasks,__n);
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::operator<<(poVar1,"]");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::print() const {
  ezc3d::Vector3d::print();
  std::cout << "Residual = " << residual() << "; Masks = [";
  for (size_t i = 0; i < _cameraMasks.size() - 1; ++i) {
    std::cout << _cameraMasks[i] << ", ";
  }
  if (_cameraMasks.size() > 0) {
    std::cout << _cameraMasks[_cameraMasks.size() - 1] << "]";
  }
  std::cout << "\n";
}